

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_loadnil(function *fn,int A,int B,int pc)

{
  bool bVar1;
  int local_20;
  int b;
  int pc_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  local_20 = B;
  do {
    membuff_add_fstring(&fn->body,"setnilvalue(ra++);\n");
    bVar1 = local_20 != 0;
    local_20 = local_20 + -1;
  } while (bVar1);
  return;
}

Assistant:

static void emit_op_loadnil(struct function *fn, int A, int B, int pc) {
  (void)pc;
  int b = B;
  emit_reg(fn, "ra", A);
  do {
    membuff_add_fstring(&fn->body, "setnilvalue(ra++);\n");
  } while (b--);
}